

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

void accum_global_gauden(vector_t ***acc,vector_t ***l_acc,gauden_t *g,uint32 *lcl2glb,
                        uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (acc != (vector_t ***)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (uVar6 = 0; uVar6 != n_lcl2glb; uVar6 = uVar6 + 1) {
      uVar3 = lcl2glb[uVar6];
      for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
        for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
          uVar4 = g->veclen[uVar5];
          for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
            acc[uVar3][uVar5][uVar8][uVar7] =
                 l_acc[uVar6][uVar5][uVar8][uVar7] + acc[uVar3][uVar5][uVar8][uVar7];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
accum_global_gauden(vector_t ***acc,
		    vector_t ***l_acc,
		    gauden_t *g,
		    uint32 *lcl2glb,
		    uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    acc[i][j][k][l] += l_acc[ii][j][k][l];
		}
	    }
	}
    }
}